

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

Cookie * dup_cookie(Cookie *src)

{
  char *pcVar1;
  Cookie *d;
  Cookie *src_local;
  
  src_local = (Cookie *)(*Curl_ccalloc)(1,0x48);
  if (src_local == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (src->domain == (char *)0x0) {
LAB_0012983c:
    if (src->path != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(src->path);
      src_local->path = pcVar1;
      if (src_local->path == (char *)0x0) goto LAB_001299a7;
    }
    if (src->spath != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(src->spath);
      src_local->spath = pcVar1;
      if (src_local->spath == (char *)0x0) goto LAB_001299a7;
    }
    if (src->name != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(src->name);
      src_local->name = pcVar1;
      if (src_local->name == (char *)0x0) goto LAB_001299a7;
    }
    if (src->value != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(src->value);
      src_local->value = pcVar1;
      if (src_local->value == (char *)0x0) goto LAB_001299a7;
    }
    src_local->expires = src->expires;
    src_local->tailmatch = (_Bool)(src->tailmatch & 1);
    src_local->secure = (_Bool)(src->secure & 1);
    src_local->livecookie = (_Bool)(src->livecookie & 1);
    src_local->httponly = (_Bool)(src->httponly & 1);
    src_local->creationtime = src->creationtime;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(src->domain);
    src_local->domain = pcVar1;
    if (src_local->domain != (char *)0x0) goto LAB_0012983c;
LAB_001299a7:
    freecookie(src_local);
    src_local = (Cookie *)0x0;
  }
  return src_local;
}

Assistant:

static struct Cookie *dup_cookie(struct Cookie *src)
{
  struct Cookie *d = calloc(1, sizeof(struct Cookie));
  if(d) {
    CLONE(domain);
    CLONE(path);
    CLONE(spath);
    CLONE(name);
    CLONE(value);
    d->expires = src->expires;
    d->tailmatch = src->tailmatch;
    d->secure = src->secure;
    d->livecookie = src->livecookie;
    d->httponly = src->httponly;
    d->creationtime = src->creationtime;
  }
  return d;

fail:
  freecookie(d);
  return NULL;
}